

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_join_dynamic_task_internal(Executor *this,Worker *w,Node *p,Graph *g)

{
  long *plVar1;
  long *plVar2;
  undefined1 *puVar3;
  pointer ppNVar4;
  __int_type_conflict1 _Var5;
  long *plVar6;
  pointer ppNVar7;
  Node *n;
  SmallVector<tf::Node_*,_2U> src;
  Node *local_60;
  SmallVector<tf::Node_*,_2U> local_58;
  
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
       &stack0xffffffffffffffd0;
  ppNVar4 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar7 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar4 == ppNVar7) {
    if ((p->_join_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      return;
    }
    ppNVar4 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar7 = (g->_nodes).super__Vector_base<tf::Node_*,_std::allocator<tf::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX =
       &local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX =
       local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
       super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  puVar3 = &stack0xffffffffffffffd0;
  if (ppNVar4 != ppNVar7) {
    do {
      local_60 = *ppNVar4;
      local_60->_topology = p->_topology;
      (local_60->_state).super___atomic_base<int>._M_i = 0;
      plVar1 = (long *)(local_60->_dependents).super_SmallVectorImpl<tf::Node_*>.
                       super_SmallVectorTemplateBase<tf::Node_*,_true>.
                       super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
                       BeginX;
      plVar2 = (long *)(local_60->_dependents).super_SmallVectorImpl<tf::Node_*>.
                       super_SmallVectorTemplateBase<tf::Node_*,_true>.
                       super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
      if (plVar1 == plVar2) {
        (local_60->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
        local_60->_parent = p;
LAB_0012c9e6:
        SmallVectorTemplateBase<tf::Node_*,_true>::push_back
                  ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_58,&local_60);
      }
      else {
        _Var5 = 0;
        plVar6 = plVar1;
        do {
          if ((byte)(*(char *)(*plVar6 + 0x68) - 3U) < 2) {
            LOCK();
            (local_60->_state).super___atomic_base<int>._M_i =
                 (local_60->_state).super___atomic_base<int>._M_i | 1;
            UNLOCK();
          }
          else {
            _Var5 = _Var5 + 1;
          }
          plVar6 = plVar6 + 1;
        } while (plVar6 != plVar2);
        (local_60->_join_counter).super___atomic_base<unsigned_long>._M_i = _Var5;
        local_60->_parent = p;
        if (plVar1 == plVar2) goto LAB_0012c9e6;
      }
      ppNVar4 = ppNVar4 + 1;
      puVar3 = (undefined1 *)
               local_58.super_SmallVectorImpl<tf::Node_*>.
               super_SmallVectorTemplateBase<tf::Node_*,_true>.
               super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX;
    } while (ppNVar4 != ppNVar7);
  }
  local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
  super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX = puVar3;
  LOCK();
  (p->_join_counter).super___atomic_base<unsigned_long>._M_i =
       (p->_join_counter).super___atomic_base<unsigned_long>._M_i +
       ((long)local_58.super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX -
        (long)local_58.super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX >> 3);
  UNLOCK();
  _schedule(this,w,&local_58);
  _consume_task(this,w,p);
  if ((U *)local_58.super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX !=
      &local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
       super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl) {
    free(local_58.super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
         super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX);
  }
  return;
}

Assistant:

inline void Executor::_join_dynamic_task_internal(
  Worker& w, Node* p, Graph& g
) {

  // graph is empty and has no async tasks
  if(g.empty() && p->_join_counter == 0) {
    return;
  }

  SmallVector<Node*> src;

  for(auto n : g._nodes) {
    n->_topology = p->_topology;
    n->_state.store(0, std::memory_order_relaxed);
    n->_set_up_join_counter();
    n->_parent = p;
    if(n->num_dependents() == 0) {
      src.push_back(n);
    }
  }
  p->_join_counter.fetch_add(src.size());
  _schedule(w, src);
  _consume_task(w, p);
}